

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

IStreamingReporterPtr __thiscall
Catch::ReporterRegistry::create(ReporterRegistry *this,string *name,IConfigPtr *config)

{
  bool bVar1;
  ReporterConfig *this_00;
  __uniq_ptr_data<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>,_true,_true>
  in_RDI;
  const_iterator it;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>_>_>_>
  *in_stack_ffffffffffffff78;
  unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
  *in_stack_ffffffffffffff80;
  undefined1 local_48 [24];
  _Self local_30;
  _Self local_28 [5];
  
  local_28[0]._M_node =
       (_Base_ptr)
       clara::std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>_>_>_>
       ::find(in_stack_ffffffffffffff78,(key_type *)0x1258c3);
  local_30._M_node =
       (_Base_ptr)
       clara::std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>_>_>_>
       ::end(in_stack_ffffffffffffff78);
  bVar1 = clara::std::operator==(local_28,&local_30);
  if (bVar1) {
    std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>::
    unique_ptr<std::default_delete<Catch::IStreamingReporter>,void>
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  else {
    clara::std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>_>_>
    ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Catch::IReporterFactory>_>_>
                  *)0x12590a);
    this_00 = (ReporterConfig *)
              clara::std::
              __shared_ptr_access<Catch::IReporterFactory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<Catch::IReporterFactory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x125916);
    ReporterConfig::ReporterConfig(this_00,(IConfigPtr *)in_stack_ffffffffffffff78);
    (**(code **)(this_00->m_stream + 0x10))
              (in_RDI.
               super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
               ._M_t.
               super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
               .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl,this_00,
               local_48);
    ReporterConfig::~ReporterConfig((ReporterConfig *)0x125953);
  }
  return (__uniq_ptr_data<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>,_true,_true>
          )(tuple<Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>)
           in_RDI.
           super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
           ._M_t.
           super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
           .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl;
}

Assistant:

IStreamingReporterPtr ReporterRegistry::create( std::string const& name, IConfigPtr const& config ) const {
        auto it =  m_factories.find( name );
        if( it == m_factories.end() )
            return nullptr;
        return it->second->create( ReporterConfig( config ) );
    }